

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editline.c
# Opt level: O1

el_status_t exchange(void)

{
  int iVar1;
  int iVar2;
  el_status_t eVar3;
  
  iVar2 = tty_get();
  iVar1 = rl_mark;
  if (iVar2 == -1) {
    eVar3 = CSeof;
  }
  else if (iVar2 == 0x18) {
    eVar3 = CSstay;
    if (rl_mark <= rl_end) {
      rl_mark = rl_point;
      rl_point = iVar1;
      eVar3 = CSmove;
    }
  }
  else {
    tty_put('\a');
    tty_flush();
    eVar3 = CSstay;
  }
  return eVar3;
}

Assistant:

static el_status_t exchange(void)
{
    int c;

    if ((c = tty_get()) != CTL('X'))
        return c == EOF ? CSeof : el_ring_bell();

    if ((c = rl_mark) <= rl_end) {
        rl_mark = rl_point;
        rl_point = c;
        return CSmove;
    }

    return CSstay;
}